

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNAddrBase::fold_constants(CTPNAddrBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  CTPNAddrBase *pCVar2;
  
  iVar1 = (*(((this->super_CTPNUnary).super_CTPNUnaryBase.sub_)->super_CTcPrsNodeBase).
            _vptr_CTcPrsNodeBase[0x10])();
  pCVar2 = (CTPNAddrBase *)CONCAT44(extraout_var,iVar1);
  if ((CTPNAddrBase *)CONCAT44(extraout_var,iVar1) == (CTPNAddrBase *)0x0) {
    pCVar2 = this;
  }
  return (CTcPrsNode *)pCVar2;
}

Assistant:

CTcPrsNode *CTPNAddrBase::fold_constants(CTcPrsSymtab *symtab)
{
    CTcPrsNode *ret;

    /* ask the symbol to generate a constant expression for its address */
    ret = get_sub_expr()->fold_addr_const(symtab);

    /* 
     *   if we got a constant value, return it; otherwise, return myself
     *   unchanged 
     */
    return (ret != 0 ? ret : this);
}